

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jumptable.cc
# Opt level: O0

bool __thiscall JumpBasic::foldInGuards(JumpBasic *this,Funcdata *fd,JumpTable *jump)

{
  bool bVar1;
  uint uVar2;
  size_type sVar3;
  reference pvVar4;
  PcodeOp *this_00;
  PcodeOp *cbranch;
  int4 i;
  bool change;
  JumpTable *jump_local;
  Funcdata *fd_local;
  JumpBasic *this_local;
  
  cbranch._7_1_ = false;
  for (cbranch._0_4_ = 0;
      sVar3 = std::vector<GuardRecord,_std::allocator<GuardRecord>_>::size(&this->selectguards),
      (ulong)(long)(int)cbranch < sVar3; cbranch._0_4_ = (int)cbranch + 1) {
    pvVar4 = std::vector<GuardRecord,_std::allocator<GuardRecord>_>::operator[]
                       (&this->selectguards,(long)(int)cbranch);
    this_00 = GuardRecord::getBranch(pvVar4);
    if (this_00 != (PcodeOp *)0x0) {
      bVar1 = PcodeOp::isDead(this_00);
      if (bVar1) {
        pvVar4 = std::vector<GuardRecord,_std::allocator<GuardRecord>_>::operator[]
                           (&this->selectguards,(long)(int)cbranch);
        GuardRecord::clear(pvVar4);
      }
      else {
        pvVar4 = std::vector<GuardRecord,_std::allocator<GuardRecord>_>::operator[]
                           (&this->selectguards,(long)(int)cbranch);
        uVar2 = (*(this->super_JumpModel)._vptr_JumpModel[0xf])(this,fd,pvVar4,jump);
        if ((uVar2 & 1) != 0) {
          cbranch._7_1_ = true;
        }
      }
    }
  }
  return cbranch._7_1_;
}

Assistant:

bool JumpBasic::foldInGuards(Funcdata *fd,JumpTable *jump)

{ // We now think of the BRANCHIND as encompassing
  // the guard function, so we "disarm" the guard
  // instructions by making the guard condition
  // always false.  If the simplification removes
  // the unusable branches, we are left with only
  // one path through the switch
  bool change = false;
  for(int4 i=0;i<selectguards.size();++i) {
    PcodeOp *cbranch = selectguards[i].getBranch();
    if (cbranch == (PcodeOp *)0) continue; // Already normalized
    if (cbranch->isDead()) {
      selectguards[i].clear();
      continue;
    }
    if (foldInOneGuard(fd,selectguards[i],jump))
      change = true;
  }
  return change;
}